

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

size_t sysbvm_dwarf_encodeStringTupleWithDefaultString
                 (sysbvm_dynarray_t *buffer,sysbvm_tuple_t stringTuple,char *defaultString)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  char local_19;
  
  sVar1 = buffer->size;
  bVar5 = (stringTuple & 0xf) != 0;
  bVar2 = bVar5 || stringTuple == 0;
  if (((bVar2) || ((*(uint *)(stringTuple + 8) & 0x300) != 0x200 || bVar2)) ||
     (*(int *)(stringTuple + 0xc) == 0)) {
    sVar3 = strlen(defaultString);
    sVar4 = sVar3 + 1;
  }
  else {
    if (bVar5 || stringTuple == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = (size_t)*(uint *)(stringTuple + 0xc);
    }
    sysbvm_dynarray_addAll(buffer,sVar4,(void *)(stringTuple + 0x10));
    defaultString = &local_19;
    local_19 = '\0';
    sVar4 = 1;
  }
  sysbvm_dynarray_addAll(buffer,sVar4,defaultString);
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeStringTupleWithDefaultString(sysbvm_dynarray_t *buffer, sysbvm_tuple_t stringTuple, const char *defaultString)
{
    size_t offset = buffer->size;
    if(sysbvm_tuple_isBytes(stringTuple) && sysbvm_tuple_getSizeInBytes(stringTuple) > 0)
    {
        sysbvm_dynarray_addAll(buffer, sysbvm_tuple_getSizeInBytes(stringTuple), SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(stringTuple)->bytes);
        sysbvm_dwarf_encodeByte(buffer, 0);
    }
    else
    {
        sysbvm_dwarf_encodeCString(buffer, defaultString);
    }

    return offset;
}